

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMLEulerAngles.cpp
# Opt level: O1

EulerAngles *
AML::convertEulerAngleSequence
          (EulerAngles *__return_storage_ptr__,EulerAngles *angles,EulerSequence seq)

{
  EulerSequence EVar1;
  double dVar2;
  double dVar3;
  undefined4 uVar4;
  Matrix33 dcm;
  Matrix33 local_60;
  
  EVar1 = angles->seq_;
  if (EVar1 == seq) {
    dVar2 = angles->phi;
    dVar3 = angles->theta;
    EVar1 = angles->seq_;
    uVar4 = *(undefined4 *)&angles->field_0x1c;
    __return_storage_ptr__->psi = angles->psi;
    __return_storage_ptr__->seq_ = EVar1;
    *(undefined4 *)&__return_storage_ptr__->field_0x1c = uVar4;
    __return_storage_ptr__->phi = dVar2;
    __return_storage_ptr__->theta = dVar3;
  }
  else if (EVar1 == XYZ && seq == ZXZ) {
    converEulerAnglesXYZtoZXZ(__return_storage_ptr__,angles->phi,angles->theta,angles->psi);
  }
  else if (seq == XYZ && EVar1 == ZXZ) {
    converEulerAnglesZXZtoXYZ(__return_storage_ptr__,angles->phi,angles->theta,angles->psi);
  }
  else {
    eulerAngles2DCM(&local_60,angles);
    dcm2EulerAngles(__return_storage_ptr__,&local_60,seq);
  }
  return __return_storage_ptr__;
}

Assistant:

EulerAngles convertEulerAngleSequence(const EulerAngles& angles, const EulerAngles::EulerSequence seq)
    {
        if (angles.getEulerSequence() == seq)
        {
            return angles;
        }
        else if (angles.getEulerSequence() == EulerAngles::EulerSequence::XYZ && seq == EulerAngles::EulerSequence::ZXZ)
        {
            return converEulerAnglesXYZtoZXZ(angles.phi, angles.theta, angles.psi);
        }
        else if (angles.getEulerSequence() == EulerAngles::EulerSequence::ZXZ && seq == EulerAngles::EulerSequence::XYZ)
        {
            return converEulerAnglesZXZtoXYZ(angles.phi, angles.theta, angles.psi);
        }
        else // General Case
        {
            Matrix33 dcm = eulerAngles2DCM(angles);
            return dcm2EulerAngles(dcm, seq);
        }
    }